

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QDateTimeEdit::setTimeSpec(QDateTimeEdit *this,TimeSpec spec)

{
  QDebug *pQVar1;
  long in_FS_OFFSET;
  Data local_60;
  undefined4 uStack_58;
  undefined8 uStack_54;
  undefined4 local_4c;
  char *local_48;
  QDebug local_40;
  QDebug local_38;
  undefined1 local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int *)(*(long *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8 + 0x508) - UTC &
      TimeZone) != spec) {
    if (spec == LocalTime) {
      local_60._0_4_ = 1;
    }
    else {
      if (spec != UTC) {
        local_60._0_4_ = 2;
        local_4c = 0;
        local_60._4_4_ = 0;
        uStack_58 = 0;
        uStack_54 = 0;
        local_48 = "default";
        QMessageLogger::warning();
        pQVar1 = QDebug::operator<<(&local_40,"Ignoring attempt to set time-spec");
        local_38.stream = pQVar1->stream;
        *(int *)(local_38.stream + 0x28) = *(int *)(local_38.stream + 0x28) + 1;
        ::operator<<((Stream *)local_30,(TimeSpec)&local_38);
        QDebug::operator<<((QDebug *)local_30,"which needs ancillary data: see setTimeZone()");
        QDebug::~QDebug((QDebug *)local_30);
        QDebug::~QDebug(&local_38);
        QDebug::~QDebug(&local_40);
        goto LAB_003c0165;
      }
      local_60._0_4_ = 2;
    }
    local_60._4_4_ = 0;
    setTimeZone(this,(QTimeZone *)&local_60.s);
    QTimeZone::~QTimeZone((QTimeZone *)&local_60.s);
  }
LAB_003c0165:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setTimeSpec(Qt::TimeSpec spec)
{
    Q_D(QDateTimeEdit);
    if (spec != d->timeZone.timeSpec()) {
        switch (spec) {
        case Qt::UTC:
            setTimeZone(QTimeZone::UTC);
            break;
        case Qt::LocalTime:
            setTimeZone(QTimeZone::LocalTime);
            break;
        default:
            qWarning() << "Ignoring attempt to set time-spec" << spec
                       << "which needs ancillary data: see setTimeZone()";
            return;
        }
    }
}